

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_arrayinsert(HSQUIRRELVM v,SQInteger idx,SQInteger destpos)

{
  SQArray *this;
  bool bVar1;
  SQObjectPtr *in_RAX;
  SQObject *val;
  SQRESULT SVar2;
  SQObjectPtr *arr;
  
  if (v->_stackbase < v->_top) {
    arr = in_RAX;
    bVar1 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&arr);
    if (bVar1) {
      this = (arr->super_SQObject)._unVal.pArray;
      SVar2 = -1;
      val = &SQVM::GetUp(v,-1)->super_SQObject;
      bVar1 = SQArray::Insert(this,destpos,val);
      if (bVar1) {
        SVar2 = 0;
      }
      else {
        sq_throwerror(v,"index out of range");
      }
      SQVM::Pop(v);
      return SVar2;
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
  }
  return -1;
}

Assistant:

SQRESULT sq_arrayinsert(HSQUIRRELVM v,SQInteger idx,SQInteger destpos)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    SQRESULT ret = _array(*arr)->Insert(destpos, v->GetUp(-1)) ? SQ_OK : sq_throwerror(v,_SC("index out of range"));
    v->Pop();
    return ret;
}